

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

int AF_AWeapon_A_ZoomFactor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  TArray<VMValue,_VMValue> *pTVar7;
  char *pcVar8;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
LAB_004af290:
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar9 = (undefined8 *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar9 == (undefined8 *)0x0) {
LAB_004af104:
          puVar9 = (undefined8 *)0x0;
          pTVar7 = defaultparam;
        }
        else {
          auVar14._8_8_ = uVar6;
          auVar14._0_8_ = puVar9[1];
          if (puVar9[1] == 0) {
            auVar14 = (**(code **)*puVar9)(puVar9);
            puVar9[1] = auVar14._0_8_;
          }
          pPVar5 = auVar14._0_8_;
          bVar10 = pPVar5 == (PClass *)0x0;
          ret = (VMReturn *)(ulong)!bVar10;
          uVar6 = (ulong)bVar10;
          bVar11 = pPVar5 == pPVar4;
          if (!bVar11 && !bVar10) {
            do {
              pPVar5 = pPVar5->ParentClass;
              ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
              if (pPVar5 == pPVar4) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          pTVar7 = (TArray<VMValue,_VMValue> *)(ulong)(bVar11 || bVar10);
          if ((char)ret == '\0') {
            pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_004af2a0;
          }
        }
        pPVar4 = AActor::RegistrationInfo.MyClass;
        if (numparam == 1) goto LAB_004af290;
        if (param[1].field_0.field_3.Type == '\x03') {
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar5 = (PClass *)puVar2[1];
              if (pPVar5 == (PClass *)0x0) {
                pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pTVar7,uVar6,ret);
                puVar2[1] = pPVar5;
              }
              bVar10 = pPVar5 != (PClass *)0x0;
              if (pPVar5 != pPVar4 && bVar10) {
                do {
                  pPVar5 = pPVar5->ParentClass;
                  bVar10 = pPVar5 != (PClass *)0x0;
                  if (pPVar5 == pPVar4) break;
                } while (pPVar5 != (PClass *)0x0);
              }
              if (!bVar10) {
                pcVar8 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_004af2a0;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_004af287;
          if (2 < numparam) {
            if (param[2].field_0.field_3.Type == '\x03') {
              if (numparam == 3) {
                param = defaultparam->Array;
                if (param[3].field_0.field_3.Type != '\x01') {
                  pcVar8 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004af2e7:
                  __assert_fail(pcVar8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                                ,0x82a,
                                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                dVar12 = param[3].field_0.f;
              }
              else {
                if (param[3].field_0.field_3.Type != '\x01') {
                  pcVar8 = "(param[paramnum]).Type == REGT_FLOAT";
                  goto LAB_004af2e7;
                }
                dVar12 = param[3].field_0.f;
                if (4 < (uint)numparam) {
                  if (param[4].field_0.field_3.Type != '\0') {
                    pcVar8 = "(param[paramnum]).Type == REGT_INT";
                    goto LAB_004af2bf;
                  }
                  goto LAB_004af1ef;
                }
                param = defaultparam->Array;
              }
              if (param[4].field_0.field_3.Type != '\0') {
                pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004af2bf:
                __assert_fail(pcVar8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                              ,0x82b,
                              "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
LAB_004af1ef:
              lVar3 = puVar9[0x46];
              if ((lVar3 != 0) && (*(long *)(lVar3 + 0xd0) != 0)) {
                uVar1 = param[4].field_0.i;
                dVar13 = 50.0;
                if (dVar12 <= 50.0) {
                  dVar13 = dVar12;
                }
                dVar12 = (double)(-(ulong)(0.1 < dVar12) & (ulong)(1.0 / dVar13) |
                                 ~-(ulong)(0.1 < dVar12) & 0x4024000000000000);
                if ((uVar1 & 1) != 0) {
                  *(float *)(lVar3 + 0x5c) = (float)((double)*(float *)(lVar3 + 0x58) * dVar12);
                }
                if ((uVar1 & 2) != 0) {
                  dVar12 = -dVar12;
                }
                *(float *)(*(long *)(lVar3 + 0xd0) + 0x598) = (float)dVar12;
              }
              return 0;
            }
            pcVar8 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_004af2a0;
          }
          goto LAB_004af290;
        }
      }
      else if (puVar9 == (undefined8 *)0x0) goto LAB_004af104;
    }
LAB_004af287:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004af2a0:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                ,0x829,
                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, A_ZoomFactor)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(zoom);
	PARAM_INT_DEF(flags);

	if (self->player != NULL && self->player->ReadyWeapon != NULL)
	{
		zoom = 1 / clamp(zoom, 0.1, 50.0);
		if (flags & 1)
		{ // Make the zoom instant.
			self->player->FOV = float(self->player->DesiredFOV * zoom);
		}
		if (flags & 2)
		{ // Disable pitch/yaw scaling.
			zoom = -zoom;
		}
		self->player->ReadyWeapon->FOVScale = float(zoom);
	}
	return 0;
}